

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O0

void __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::bubbleUp
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode)

{
  bool bVar1;
  BNode<ADS::NodeDistancePairClass_*> *pNode_local;
  BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this_local;
  
  while ((pNode->pParent != (BNode<ADS::NodeDistancePairClass_*> *)0x0 &&
         (bVar1 = isHead(this,pNode,pNode->pParent), bVar1))) {
    swap(this,pNode,pNode->pParent);
  }
  if ((pNode->pParent == (BNode<ADS::NodeDistancePairClass_*> *)0x0) &&
     (bVar1 = isHead(this,pNode,this->_pHead), bVar1)) {
    this->_pHead = pNode;
  }
  return;
}

Assistant:

void BHeap<T, Comparator>::bubbleUp (BNode<T> *pNode)
    {
        while (pNode->pParent != NULL) {
            if (isHead (pNode, pNode->pParent))
                swap (pNode, pNode->pParent);
            else
                break;
        }

        if (pNode->pParent == NULL)
            /* it made it to the root - it may be the new head */
            if (isHead (pNode, _pHead))
                _pHead = pNode;
    }